

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirDEFARRAY(void)

{
  char cVar1;
  CStringsList *pCVar2;
  bool bVar3;
  int iVar4;
  char *name;
  char *message;
  CStringsList *a;
  
  cVar1 = *lp;
  if (cVar1 == '+') {
    lp = lp + 1;
  }
  bVar3 = White();
  if ((bVar3) && (name = GetID(&lp), name != (char *)0x0)) {
    bVar3 = White();
    if ((bVar3) && (iVar4 = SkipBlanks(), iVar4 == 0)) {
      if (cVar1 != '+') {
        a = (CStringsList *)0x0;
        bVar3 = dirDEFARRAY_parseItems(&a);
        pCVar2 = a;
        if (bVar3 && a != (CStringsList *)0x0) {
          CDefineTable::Add(&DefineTable,name,"",a);
          return;
        }
        if (a == (CStringsList *)0x0) {
          return;
        }
        CStringsList::~CStringsList(a);
        operator_delete(pCVar2,0x28);
        return;
      }
      CDefineTable::Get(&DefineTable,name);
      pCVar2 = DefineTable.DefArrayList;
      if (DefineTable.DefArrayList != (CStringsList *)0x0) {
        do {
          DefineTable.DefArrayList = pCVar2;
          pCVar2 = (DefineTable.DefArrayList)->next;
        } while ((DefineTable.DefArrayList)->next != (CStringsList *)0x0);
        dirDEFARRAY_parseItems(&(DefineTable.DefArrayList)->next);
        return;
      }
      message = "[DEFARRAY+] unknown array <id>";
    }
    else {
      iVar4 = SkipBlanks();
      if (iVar4 == 0) {
        message = "[DEFARRAY] missing space between <id> and first <item>";
        name = lp;
      }
      else {
        message = "[DEFARRAY] must have at least one entry";
        name = (char *)0x0;
      }
    }
    Error(message,name,PASS3);
  }
  else {
    Error("[DEFARRAY] Syntax error in <id>",lp,PASS3);
  }
  SkipToEol(&lp);
  return;
}

Assistant:

static void dirDEFARRAY() {
	bool plus = ('+' == *lp) ? ++lp, true : false;
	const char* id = White() ? GetID(lp) : nullptr;
	if (!id) {
		Error("[DEFARRAY] Syntax error in <id>", lp);
		SkipToEol(lp);
		return;
	}
	if (!White() || SkipBlanks()) {	// enforce whitespace between ID and first item and detect empty ones
		if (SkipBlanks()) Error("[DEFARRAY] must have at least one entry");
		else Error("[DEFARRAY] missing space between <id> and first <item>", lp);
		SkipToEol(lp);
		return;
	}
	if (plus) {
		dirDEFARRAY_add(id);
	} else {
		CStringsList* a = NULL;
		if (!dirDEFARRAY_parseItems(&a) || NULL == a) {
			if (a) delete a;	// release already parsed items, if there was syntax error
			return;
		}
		DefineTable.Add(id, "", a);
	}
}